

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

string * __thiscall
cppcms::application::url
          (application *this,string *key,streamable *p1,streamable *p2,streamable *p3,streamable *p4
          ,streamable *p5)

{
  context *key_00;
  streamable *in_RSI;
  streamable *in_RDI;
  ostringstream ss;
  context *in_stack_fffffffffffffe08;
  streamable *p1_00;
  ostream *in_stack_fffffffffffffe38;
  url_mapper *in_stack_fffffffffffffe40;
  application *in_stack_fffffffffffffe48;
  streamable *in_stack_fffffffffffffe50;
  streamable *in_stack_fffffffffffffe58;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&stack0xfffffffffffffe58);
  p1_00 = (streamable *)(&stack0xfffffffffffffe58 + (long)in_stack_fffffffffffffe58[-1].to_stream_);
  key_00 = context(in_stack_fffffffffffffe48);
  http::context::locale(in_stack_fffffffffffffe08);
  std::ios::imbue((locale *)&stack0xfffffffffffffe50);
  std::locale::~locale((locale *)&stack0xfffffffffffffe50);
  std::locale::~locale((locale *)&stack0xfffffffffffffe48);
  mapper((application *)0x3b1d54);
  url_mapper::map(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,(string *)key_00,p1_00,in_RSI,
                  in_RDI,in_stack_fffffffffffffe50,in_stack_fffffffffffffe58);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stack0xfffffffffffffe58);
  return (string *)in_RDI;
}

Assistant:

std::string application::url(	std::string const &key,
				filters::streamable const &p1,
				filters::streamable const &p2,
				filters::streamable const &p3,
				filters::streamable const &p4,
				filters::streamable const &p5)
{
	std::ostringstream ss;
	ss.imbue(context().locale());
	mapper().map(ss,key,p1,p2,p3,p4,p5);
	return ss.str();
}